

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.h
# Opt level: O0

void __thiscall
cmInstallRuntimeDependencySet::AddExecutable
          (cmInstallRuntimeDependencySet *this,cmInstallTargetGenerator *executable)

{
  unique_ptr<cmInstallRuntimeDependencySet::TargetItem,_std::default_delete<cmInstallRuntimeDependencySet::TargetItem>_>
  local_28;
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  local_20;
  cmInstallTargetGenerator *local_18;
  cmInstallTargetGenerator *executable_local;
  cmInstallRuntimeDependencySet *this_local;
  
  local_18 = executable;
  executable_local = (cmInstallTargetGenerator *)this;
  std::make_unique<cmInstallRuntimeDependencySet::TargetItem,cmInstallTargetGenerator*&>
            ((cmInstallTargetGenerator **)&local_28);
  std::
  unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>
  ::
  unique_ptr<cmInstallRuntimeDependencySet::TargetItem,std::default_delete<cmInstallRuntimeDependencySet::TargetItem>,void>
            ((unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>
              *)&local_20,&local_28);
  AddExecutable(this,&local_20);
  std::
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<cmInstallRuntimeDependencySet::TargetItem,_std::default_delete<cmInstallRuntimeDependencySet::TargetItem>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

void AddExecutable(cmInstallTargetGenerator* executable)
  {
    this->AddExecutable(cm::make_unique<TargetItem>(executable));
  }